

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

HMAC_context * Curl_HMAC_init(HMAC_params *hashparams,uchar *key,uint keylen)

{
  uchar *puVar1;
  HMAC_context *pHVar2;
  HMAC_context *pHVar3;
  ulong uVar4;
  ulong uVar5;
  uchar b;
  uchar *local_48;
  HMAC_context *local_40;
  ulong local_38;
  
  local_48 = key;
  pHVar2 = (HMAC_context *)
           (*Curl_cmalloc)((ulong)(hashparams->hmac_ctxtsize * 2) +
                           (ulong)hashparams->hmac_resultlen + 0x18);
  if (pHVar2 != (HMAC_context *)0x0) {
    pHVar2->hmac_hash = hashparams;
    pHVar3 = pHVar2 + 1;
    pHVar2->hmac_hashctxt1 = pHVar3;
    pHVar2->hmac_hashctxt2 = (void *)((long)&pHVar2[1].hmac_hash + (ulong)hashparams->hmac_ctxtsize)
    ;
    if (hashparams->hmac_maxkeylen < keylen) {
      (*hashparams->hmac_hinit)(pHVar3);
      (*hashparams->hmac_hupdate)(pHVar2->hmac_hashctxt1,local_48,keylen);
      local_48 = (uchar *)((ulong)hashparams->hmac_ctxtsize + (long)pHVar2->hmac_hashctxt2);
      (*hashparams->hmac_hfinal)(local_48,pHVar2->hmac_hashctxt1);
      keylen = hashparams->hmac_resultlen;
      pHVar3 = (HMAC_context *)pHVar2->hmac_hashctxt1;
    }
    (*hashparams->hmac_hinit)(pHVar3);
    local_40 = pHVar2;
    (*hashparams->hmac_hinit)(pHVar2->hmac_hashctxt2);
    puVar1 = local_48;
    uVar4 = (ulong)keylen;
    local_38 = uVar4;
    for (uVar5 = 0; pHVar2 = local_40, uVar4 != uVar5; uVar5 = uVar5 + 1) {
      b = puVar1[uVar5] ^ 0x36;
      (*hashparams->hmac_hupdate)(local_40->hmac_hashctxt1,&b,1);
      uVar4 = local_38;
      b = puVar1[uVar5] ^ 0x5c;
      (*hashparams->hmac_hupdate)(pHVar2->hmac_hashctxt2,&b,1);
    }
    for (; uVar4 < hashparams->hmac_maxkeylen; uVar4 = uVar4 + 1) {
      (*hashparams->hmac_hupdate)(pHVar2->hmac_hashctxt1,"6\\",1);
      (*hashparams->hmac_hupdate)(pHVar2->hmac_hashctxt2,"\\",1);
    }
  }
  return pHVar2;
}

Assistant:

HMAC_context *
Curl_HMAC_init(const HMAC_params * hashparams,
               const unsigned char *key,
               unsigned int keylen)
{
  size_t i;
  HMAC_context *ctxt;
  unsigned char *hkey;
  unsigned char b;

  /* Create HMAC context. */
  i = sizeof *ctxt + 2 * hashparams->hmac_ctxtsize +
    hashparams->hmac_resultlen;
  ctxt = malloc(i);

  if(!ctxt)
    return ctxt;

  ctxt->hmac_hash = hashparams;
  ctxt->hmac_hashctxt1 = (void *) (ctxt + 1);
  ctxt->hmac_hashctxt2 = (void *) ((char *) ctxt->hmac_hashctxt1 +
      hashparams->hmac_ctxtsize);

  /* If the key is too long, replace it by its hash digest. */
  if(keylen > hashparams->hmac_maxkeylen) {
    (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt1);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, key, keylen);
    hkey = (unsigned char *) ctxt->hmac_hashctxt2 + hashparams->hmac_ctxtsize;
    (*hashparams->hmac_hfinal)(hkey, ctxt->hmac_hashctxt1);
    key = hkey;
    keylen = hashparams->hmac_resultlen;
  }

  /* Prime the two hash contexts with the modified key. */
  (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt1);
  (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt2);

  for(i = 0; i < keylen; i++) {
    b = (unsigned char)(*key ^ hmac_ipad);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, &b, 1);
    b = (unsigned char)(*key++ ^ hmac_opad);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt2, &b, 1);
  }

  for(; i < hashparams->hmac_maxkeylen; i++) {
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, &hmac_ipad, 1);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt2, &hmac_opad, 1);
  }

  /* Done, return pointer to HMAC context. */
  return ctxt;
}